

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afl_check.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  nbt_node *tree;
  char buf [65536];
  void *in_stack_fffffffffffefff8;
  
  __stream = _stdin;
  if ((argc < 2) || (__stream = fopen(argv[1],"rb"), __stream != (FILE *)0x0)) {
    fread(&stack0xfffffffffffefff8,1,0x10000,__stream);
    tree = nbt_parse(in_stack_fffffffffffefff8,0x10134e);
    nbt_free(tree);
    iVar1 = 0;
  }
  else {
    perror("fopen");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main(int argc, const char *argv[]) {
    FILE *in = stdin;
    if (argc > 1) {
        in = fopen(argv[1], "rb");
        if (!in) {
            perror("fopen");
            return -1;
        }
    }

#ifdef __AFL_HAVE_MANUAL_CONTROL
  __AFL_INIT();
#endif


#ifdef __AFL_HAVE_MANUAL_CONTROL
    while (__AFL_LOOP(10000)) {
#endif
        char buf[65536];
        size_t len = fread(buf, 1, sizeof(buf), in);
        nbt_free(nbt_parse(buf, len));
#ifdef __AFL_HAVE_MANUAL_CONTROL
    }
#endif
}